

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExistingStreams.cpp
# Opt level: O1

void testExistingStreams(string *tempDir)

{
  float *pfVar1;
  pointer pcVar2;
  long lVar3;
  undefined8 uVar4;
  _Alloc_hider _Var5;
  Rgba RVar6;
  pointer pHVar7;
  char cVar8;
  int iVar9;
  int iVar10;
  long *plVar11;
  Rgba *pRVar12;
  int *piVar13;
  ulong uVar14;
  void *pvVar15;
  char *pcVar16;
  undefined8 *puVar17;
  undefined8 *puVar18;
  ushort uVar19;
  undefined4 uVar20;
  int h;
  int extraout_EDX;
  int extraout_EDX_00;
  long lVar21;
  long lVar22;
  half *phVar23;
  half *phVar24;
  int i;
  ushort uVar25;
  int iVar26;
  int iVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  int x;
  uint uVar31;
  long lVar32;
  ushort uVar33;
  uint uVar34;
  long lVar35;
  bool bVar36;
  float fVar37;
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  Compression local_394;
  Header header;
  half hStack_37e;
  half hStack_37c;
  half hStack_37a;
  ulong local_378;
  ulong local_370;
  ulong *local_368;
  ulong *local_360;
  undefined8 local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  RgbaOutputFile out;
  half hStack_306;
  half hStack_304;
  half hStack_302;
  long local_2f8 [2];
  StdOFStream ofs;
  undefined4 local_2d8;
  undefined1 uStack_2d4;
  undefined1 uStack_2d3;
  undefined2 uStack_2d2;
  Rgba local_2a8;
  void *local_2a0;
  vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> headers;
  Array2D<Imf_3_2::Rgba> p1;
  MultiPartOutputFile out_4;
  ofstream os;
  filebuf local_230 [8];
  char local_228 [232];
  ios_base aiStack_140 [272];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing reading and writing using existing streams",0x32);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  uVar4 = _hasWhiteLuminance;
  lVar3 = _VTT;
  local_394 = NO_COMPRESSION;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"compression: ",0xd);
    plVar11 = (long *)std::ostream::operator<<(&std::cout,local_394);
    cVar8 = std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
    iVar26 = (int)cVar8;
    std::ostream::put((char)plVar11);
    std::ostream::flush();
    p1._sizeX = 0xed;
    p1._sizeY = 0x77;
    pRVar12 = (Rgba *)operator_new__(0x37158);
    p1._data = pRVar12;
    anon_unknown.dwarf_156821::fillPixels1(&p1,iVar26,h);
    __str._M_dataplus._M_p = (pointer)&__str.field_2;
    pcVar2 = (tempDir->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__str,pcVar2,pcVar2 + tempDir->_M_string_length);
    std::__cxx11::string::append((char *)&__str);
    _Var5 = __str._M_dataplus;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"scan-line based file:",0x15);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing",7);
    remove(_Var5._M_p);
    std::ofstream::ofstream(&os);
    std::filebuf::open((char *)local_230,(_Ios_Openmode)_Var5._M_p);
    Imf_3_2::StdOFStream::StdOFStream(&ofs,&os,_Var5._M_p);
    _out = 0;
    hStack_306._h = 0;
    hStack_304._h = 0;
    hStack_302._h = 0;
    Imf_3_2::Header::Header(&header,0x77,0xed,1.0,(Vec2 *)&out,1.0,INCREASING_Y,local_394);
    iVar26 = Imf_3_2::globalThreadCount();
    Imf_3_2::RgbaOutputFile::RgbaOutputFile(&out,(OStream *)&ofs,&header,WRITE_RGBA,iVar26);
    Imf_3_2::RgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)pRVar12,1);
    Imf_3_2::RgbaOutputFile::writePixels((int)(Rgba *)&out);
    Imf_3_2::RgbaOutputFile::~RgbaOutputFile(&out);
    Imf_3_2::Header::~Header(&header);
    Imf_3_2::StdOFStream::~StdOFStream(&ofs);
    _os = lVar3;
    *(undefined8 *)(&os + *(long *)(lVar3 + -0x18)) = uVar4;
    std::filebuf::~filebuf(local_230);
    std::ios_base::~ios_base(aiStack_140);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", reading",9);
    std::ifstream::ifstream(&os);
    std::filebuf::open(local_228,(_Ios_Openmode)_Var5._M_p);
    Imf_3_2::StdIFStream::StdIFStream((StdIFStream *)&header,(ifstream *)&os,_Var5._M_p);
    iVar26 = Imf_3_2::globalThreadCount();
    Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&ofs,(IStream *)&header,iVar26);
    piVar13 = (int *)Imf_3_2::RgbaInputFile::dataWindow();
    iVar26 = *piVar13;
    lVar35 = (long)piVar13[2] - (long)iVar26;
    uVar29 = lVar35 + 1;
    iVar10 = piVar13[1];
    iVar9 = piVar13[3] - iVar10;
    uVar34 = iVar9 + 1;
    uVar14 = (long)(int)uVar34 * uVar29;
    uVar28 = uVar14 * 8;
    if (0x1fffffffffffffff < uVar14) {
      uVar28 = 0xffffffffffffffff;
    }
    pvVar15 = operator_new__(uVar28);
    Imf_3_2::RgbaInputFile::setFrameBuffer
              ((Rgba *)&ofs,(long)pvVar15 + (long)iVar26 * -8 + (long)-iVar10 * uVar29 * 8,1);
    Imf_3_2::RgbaInputFile::readPixels((int)&ofs,piVar13[1]);
    cVar8 = Imf_3_2::isLossyCompression(local_394);
    if ((cVar8 == '\0') &&
       (std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", comparing",0xb),
       -1 < iVar9)) {
      phVar24 = &pRVar12->a;
      lVar21 = (long)pvVar15 + 6;
      uVar28 = 0;
      do {
        if (-1 < (int)lVar35) {
          uVar14 = 0;
          do {
            fVar37 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar21 + -6 + uVar14 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar24[uVar14 * 4 + -3]._h * 4);
            if ((fVar37 != *pfVar1) || (NAN(fVar37) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].r == p1[y][x].r",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x149,
                            "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            fVar37 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar21 + -4 + uVar14 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar24[uVar14 * 4 + -2]._h * 4);
            if ((fVar37 != *pfVar1) || (NAN(fVar37) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].g == p1[y][x].g",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x14a,
                            "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            fVar37 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar21 + -2 + uVar14 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar24[uVar14 * 4 + -1]._h * 4);
            if ((fVar37 != *pfVar1) || (NAN(fVar37) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].b == p1[y][x].b",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x14b,
                            "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            fVar37 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar21 + uVar14 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar24[uVar14 * 4]._h * 4);
            if ((fVar37 != *pfVar1) || (NAN(fVar37) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].a == p1[y][x].a",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x14c,
                            "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            uVar14 = uVar14 + 1;
          } while ((uVar29 & 0xffffffff) != uVar14);
        }
        uVar28 = uVar28 + 1;
        phVar24 = phVar24 + 0x1dc;
        lVar21 = lVar21 + uVar29 * 8;
      } while (uVar28 != uVar34);
    }
    operator_delete__(pvVar15);
    Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&ofs);
    Imf_3_2::StdIFStream::~StdIFStream((StdIFStream *)&header);
    std::ifstream::~ifstream(&os);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,", reading (memory-mapped)",0x19);
    anon_unknown.dwarf_156821::MMIFStream::MMIFStream((MMIFStream *)&os,_Var5._M_p);
    iVar26 = Imf_3_2::globalThreadCount();
    Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&ofs,(IStream *)&os,iVar26);
    piVar13 = (int *)Imf_3_2::RgbaInputFile::dataWindow();
    iVar26 = *piVar13;
    lVar35 = (long)piVar13[2] - (long)iVar26;
    uVar29 = lVar35 + 1;
    iVar10 = piVar13[1];
    iVar9 = piVar13[3] - iVar10;
    uVar34 = iVar9 + 1;
    uVar14 = (long)(int)uVar34 * uVar29;
    uVar28 = uVar14 * 8;
    if (0x1fffffffffffffff < uVar14) {
      uVar28 = 0xffffffffffffffff;
    }
    pvVar15 = operator_new__(uVar28);
    Imf_3_2::RgbaInputFile::setFrameBuffer
              ((Rgba *)&ofs,(long)pvVar15 + (long)iVar26 * -8 + (long)-iVar10 * uVar29 * 8,1);
    Imf_3_2::RgbaInputFile::readPixels((int)&ofs,piVar13[1]);
    cVar8 = Imf_3_2::isLossyCompression(local_394);
    if ((cVar8 == '\0') &&
       (std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", comparing",0xb),
       -1 < iVar9)) {
      phVar24 = &(p1._data)->a;
      lVar21 = (long)pvVar15 + 6;
      uVar28 = 0;
      do {
        if (-1 < (int)lVar35) {
          uVar14 = 0;
          do {
            fVar37 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar21 + -6 + uVar14 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar24[uVar14 * 4 + -3]._h * 4);
            if ((fVar37 != *pfVar1) || (NAN(fVar37) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].r == p1[y][x].r",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x168,
                            "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            fVar37 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar21 + -4 + uVar14 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar24[uVar14 * 4 + -2]._h * 4);
            if ((fVar37 != *pfVar1) || (NAN(fVar37) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].g == p1[y][x].g",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x169,
                            "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            fVar37 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar21 + -2 + uVar14 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar24[uVar14 * 4 + -1]._h * 4);
            if ((fVar37 != *pfVar1) || (NAN(fVar37) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].b == p1[y][x].b",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x16a,
                            "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            fVar37 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar21 + uVar14 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar24[uVar14 * 4]._h * 4);
            if ((fVar37 != *pfVar1) || (NAN(fVar37) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].a == p1[y][x].a",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x16b,
                            "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            uVar14 = uVar14 + 1;
          } while ((uVar29 & 0xffffffff) != uVar14);
        }
        uVar28 = uVar28 + 1;
        phVar24 = phVar24 + p1._sizeY * 4;
        lVar21 = lVar21 + uVar29 * 8;
      } while (uVar28 != uVar34);
    }
    operator_delete__(pvVar15);
    Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&ofs);
    anon_unknown.dwarf_156821::MMIFStream::~MMIFStream((MMIFStream *)&os);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    remove(_Var5._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != &__str.field_2) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"scan-line based stringstream:",0x1d);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    _header = (Rgba)&local_370;
    local_378 = 0;
    local_370 = local_370 & 0xffffffffffffff00;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing",7);
    Imf_3_2::StdOSStream::StdOSStream((StdOSStream *)&os);
    __str._M_dataplus._M_p = (pointer)0x0;
    Imf_3_2::Header::Header
              ((Header *)&ofs,0x77,0xed,1.0,(Vec2 *)&__str,1.0,INCREASING_Y,ZIP_COMPRESSION);
    iVar26 = Imf_3_2::globalThreadCount();
    Imf_3_2::RgbaOutputFile::RgbaOutputFile(&out,(OStream *)&os,(Header *)&ofs,WRITE_RGBA,iVar26);
    pRVar12 = p1._data;
    Imf_3_2::RgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)p1._data,1);
    Imf_3_2::RgbaOutputFile::writePixels((int)(Rgba *)&out);
    Imf_3_2::StdOSStream::str_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&header,(string *)&__str);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != &__str.field_2) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    Imf_3_2::RgbaOutputFile::~RgbaOutputFile(&out);
    Imf_3_2::Header::~Header((Header *)&ofs);
    Imf_3_2::StdOSStream::~StdOSStream((StdOSStream *)&os);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", reading",9);
    Imf_3_2::StdISStream::StdISStream((StdISStream *)&os);
    Imf_3_2::StdISStream::clear();
    Imf_3_2::StdISStream::str((string *)&os);
    iVar26 = Imf_3_2::globalThreadCount();
    Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&ofs,(IStream *)&os,iVar26);
    piVar13 = (int *)Imf_3_2::RgbaInputFile::dataWindow();
    iVar26 = *piVar13;
    lVar35 = (long)piVar13[2] - (long)iVar26;
    uVar29 = lVar35 + 1;
    iVar10 = piVar13[1];
    iVar9 = piVar13[3] - iVar10;
    uVar34 = iVar9 + 1;
    uVar14 = (long)(int)uVar34 * uVar29;
    uVar28 = uVar14 * 8;
    if (0x1fffffffffffffff < uVar14) {
      uVar28 = 0xffffffffffffffff;
    }
    pvVar15 = operator_new__(uVar28);
    Imf_3_2::RgbaInputFile::setFrameBuffer
              ((Rgba *)&ofs,(long)pvVar15 + (long)iVar26 * -8 + (long)-iVar10 * uVar29 * 8,1);
    Imf_3_2::RgbaInputFile::readPixels((int)&ofs,piVar13[1]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", comparing",0xb);
    if (-1 < iVar9) {
      phVar24 = &pRVar12->a;
      lVar21 = (long)pvVar15 + 6;
      uVar28 = 0;
      do {
        if (-1 < (int)lVar35) {
          uVar14 = 0;
          do {
            fVar37 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar21 + -6 + uVar14 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar24[uVar14 * 4 + -3]._h * 4);
            if ((fVar37 != *pfVar1) || (NAN(fVar37) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].r == p1[y][x].r",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x2ff,
                            "void (anonymous namespace)::writeReadScanLines(int, int, const Array2D<Rgba> &)"
                           );
            }
            fVar37 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar21 + -4 + uVar14 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar24[uVar14 * 4 + -2]._h * 4);
            if ((fVar37 != *pfVar1) || (NAN(fVar37) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].g == p1[y][x].g",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x300,
                            "void (anonymous namespace)::writeReadScanLines(int, int, const Array2D<Rgba> &)"
                           );
            }
            fVar37 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar21 + -2 + uVar14 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar24[uVar14 * 4 + -1]._h * 4);
            if ((fVar37 != *pfVar1) || (NAN(fVar37) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].b == p1[y][x].b",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x301,
                            "void (anonymous namespace)::writeReadScanLines(int, int, const Array2D<Rgba> &)"
                           );
            }
            fVar37 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar21 + uVar14 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar24[uVar14 * 4]._h * 4);
            if ((fVar37 != *pfVar1) || (NAN(fVar37) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].a == p1[y][x].a",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x302,
                            "void (anonymous namespace)::writeReadScanLines(int, int, const Array2D<Rgba> &)"
                           );
            }
            uVar14 = uVar14 + 1;
          } while ((uVar29 & 0xffffffff) != uVar14);
        }
        uVar28 = uVar28 + 1;
        phVar24 = phVar24 + p1._sizeY * 4;
        lVar21 = lVar21 + uVar29 * 8;
      } while (uVar28 != uVar34);
    }
    operator_delete__(pvVar15);
    Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&ofs);
    Imf_3_2::StdISStream::~StdISStream((StdISStream *)&os);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    if (_header != (Rgba)&local_370) {
      operator_delete((void *)_header,local_370 + 1);
    }
    lVar21 = p1._sizeY;
    lVar35 = _imath_half_to_float_table;
    phVar24 = &pRVar12->a;
    lVar22 = 0;
    do {
      fVar37 = (float)((uint)lVar22 & 2);
      uVar31 = (uint)fVar37 & 0x7fffff | 0x800000;
      cVar8 = (char)((uint)fVar37 >> 0x17);
      uVar34 = (uint)fVar37 >> 0xd & 0x3ff;
      uVar19 = (ushort)uVar34 | 0x7c00 | (ushort)(uVar34 == 0);
      uVar25 = (ushort)(0x80000000 < uVar31 << (cVar8 + 0xa2U & 0x1f)) +
               (short)(uVar31 >> (0x7eU - cVar8 & 0x1f));
      uVar33 = (ushort)((int)fVar37 + 0x8000fff + (uint)(((uint)fVar37 >> 0xd & 1) != 0) >> 0xd);
      if (0x477fefff < (uint)fVar37) {
        uVar33 = 0x7c00;
      }
      if (fVar37 == INFINITY) {
        uVar19 = 0x7c00;
      }
      if ((uint)fVar37 < 0x7f800000) {
        uVar19 = uVar33;
      }
      if ((uint)fVar37 < 0x33000001) {
        uVar25 = 0;
      }
      if (0x387fffff < (uint)fVar37) {
        uVar25 = uVar19;
      }
      lVar32 = 0;
      do {
        fVar37 = (float)((uint)lVar32 & 2);
        if ((uint)fVar37 < 0x38800000) {
          if ((uint)fVar37 < 0x33000001) {
            uVar33 = 0;
          }
          else {
            cVar8 = (char)((uint)fVar37 >> 0x17);
            uVar34 = (uint)fVar37 & 0x7fffff | 0x800000;
            uVar33 = (ushort)(uVar34 >> (0x7eU - cVar8 & 0x1f));
            if (0x80000000 < uVar34 << (cVar8 + 0xa2U & 0x1f)) {
              uVar33 = uVar33 + 1;
            }
          }
        }
        else if ((uint)fVar37 < 0x7f800000) {
          if ((uint)fVar37 < 0x477ff000) {
            uVar33 = (ushort)((int)fVar37 + 0x8000fff + (uint)(((uint)fVar37 >> 0xd & 1) != 0) >>
                             0xd);
          }
          else {
            uVar33 = 0x7c00;
          }
        }
        else {
          uVar33 = 0x7c00;
          if (fVar37 != INFINITY) {
            uVar34 = (uint)fVar37 >> 0xd & 0x3ff;
            uVar33 = (ushort)(uVar34 == 0) | (ushort)uVar34 | 0x7c00;
          }
        }
        fVar37 = (float)((uint)lVar22 + (uint)lVar32 & 2);
        phVar24[lVar32 * 4 + -3]._h = uVar33;
        if ((uint)fVar37 < 0x38800000) {
          if ((uint)fVar37 < 0x33000001) {
            uVar19 = 0;
          }
          else {
            cVar8 = (char)((uint)fVar37 >> 0x17);
            uVar34 = (uint)fVar37 & 0x7fffff | 0x800000;
            uVar19 = (ushort)(uVar34 >> (0x7eU - cVar8 & 0x1f));
            if (0x80000000 < uVar34 << (cVar8 + 0xa2U & 0x1f)) {
              uVar19 = uVar19 + 1;
            }
          }
        }
        else if ((uint)fVar37 < 0x7f800000) {
          if ((uint)fVar37 < 0x477ff000) {
            uVar19 = (ushort)((int)fVar37 + 0x8000fff + (uint)(((uint)fVar37 >> 0xd & 1) != 0) >>
                             0xd);
          }
          else {
            uVar19 = 0x7c00;
          }
        }
        else {
          uVar19 = 0x7c00;
          if (fVar37 != INFINITY) {
            uVar34 = (uint)fVar37 >> 0xd & 0x3ff;
            uVar19 = (ushort)(uVar34 == 0) | (ushort)uVar34 | 0x7c00;
          }
        }
        phVar24[lVar32 * 4 + -2]._h = uVar19;
        phVar24[lVar32 * 4 + -1]._h = uVar25;
        fVar38 = (*(float *)(lVar35 + (ulong)uVar33 * 4) + *(float *)(lVar35 + (ulong)uVar25 * 4) +
                 *(float *)(lVar35 + (ulong)uVar19 * 4)) / 3.0;
        fVar37 = ABS(fVar38);
        uVar33 = (ushort)((uint)fVar38 >> 0x10) & 0x8000;
        if ((uint)fVar37 < 0x38800000) {
          if ((0x33000000 < (uint)fVar37) &&
             (uVar34 = (uint)fVar37 & 0x7fffff | 0x800000, cVar8 = (char)((uint)fVar37 >> 0x17),
             uVar33 = uVar33 | (ushort)(uVar34 >> (0x7eU - cVar8 & 0x1f)),
             0x80000000 < uVar34 << (cVar8 + 0xa2U & 0x1f))) {
            uVar33 = uVar33 + 1;
          }
        }
        else if ((uint)fVar37 < 0x7f800000) {
          if ((uint)fVar37 < 0x477ff000) {
            uVar33 = (ushort)((int)fVar37 + 0x8000fff + (uint)(((uint)fVar37 >> 0xd & 1) != 0) >>
                             0xd) | uVar33;
          }
          else {
            uVar33 = uVar33 | 0x7c00;
          }
        }
        else {
          uVar33 = uVar33 | 0x7c00;
          if (fVar37 != INFINITY) {
            uVar34 = (uint)fVar37 >> 0xd & 0x3ff;
            uVar33 = uVar33 | (ushort)uVar34 | (ushort)(uVar34 == 0);
          }
        }
        phVar24[lVar32 * 4]._h = uVar33;
        lVar32 = lVar32 + 1;
      } while (lVar32 != 0x77);
      lVar22 = lVar22 + 1;
      phVar24 = phVar24 + p1._sizeY * 4;
    } while (lVar22 != 0xed);
    __str._M_dataplus._M_p = (pointer)&__str.field_2;
    pcVar2 = (tempDir->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__str,pcVar2,pcVar2 + tempDir->_M_string_length);
    std::__cxx11::string::append((char *)&__str);
    _Var5 = __str._M_dataplus;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"tiled file:",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing",7);
    remove(_Var5._M_p);
    std::ofstream::ofstream(&os);
    std::filebuf::open((char *)local_230,(_Ios_Openmode)_Var5._M_p);
    Imf_3_2::StdOFStream::StdOFStream(&ofs,&os,_Var5._M_p);
    _out = 0;
    hStack_306._h = 0;
    hStack_304._h = 0;
    hStack_302._h = 0;
    Imf_3_2::Header::Header(&header,0x77,0xed,1.0,(Vec2 *)&out,1.0,INCREASING_Y,local_394);
    iVar26 = Imf_3_2::globalThreadCount();
    Imf_3_2::TiledRgbaOutputFile::TiledRgbaOutputFile
              ((TiledRgbaOutputFile *)&out,(OStream *)&ofs,&header,WRITE_RGBA,0x14,0x14,ONE_LEVEL,
               ROUND_DOWN,iVar26);
    pRVar12 = p1._data;
    Imf_3_2::TiledRgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)p1._data,1);
    iVar9 = (int)(Rgba *)&out;
    iVar26 = Imf_3_2::TiledRgbaOutputFile::numXTiles(iVar9);
    iVar10 = Imf_3_2::TiledRgbaOutputFile::numYTiles(iVar9);
    Imf_3_2::TiledRgbaOutputFile::writeTiles(iVar9,0,iVar26 + -1,0,iVar10 + -1);
    Imf_3_2::TiledRgbaOutputFile::~TiledRgbaOutputFile((TiledRgbaOutputFile *)&out);
    Imf_3_2::Header::~Header(&header);
    Imf_3_2::StdOFStream::~StdOFStream(&ofs);
    _os = lVar3;
    *(undefined8 *)(&os + *(long *)(lVar3 + -0x18)) = uVar4;
    std::filebuf::~filebuf(local_230);
    std::ios_base::~ios_base(aiStack_140);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", reading",9);
    std::ifstream::ifstream(&os);
    std::filebuf::open(local_228,(_Ios_Openmode)_Var5._M_p);
    Imf_3_2::StdIFStream::StdIFStream((StdIFStream *)&ofs,(ifstream *)&os,_Var5._M_p);
    iVar26 = Imf_3_2::globalThreadCount();
    Imf_3_2::TiledRgbaInputFile::TiledRgbaInputFile
              ((TiledRgbaInputFile *)&header,(IStream *)&ofs,iVar26);
    piVar13 = (int *)Imf_3_2::TiledRgbaInputFile::dataWindow();
    iVar26 = *piVar13;
    lVar35 = (long)piVar13[2] - (long)iVar26;
    uVar28 = lVar35 + 1;
    iVar10 = piVar13[1];
    iVar9 = piVar13[3] - iVar10;
    uVar34 = iVar9 + 1;
    uVar14 = (long)(int)uVar34 * uVar28;
    uVar29 = uVar14 * 8;
    if (0x1fffffffffffffff < uVar14) {
      uVar29 = 0xffffffffffffffff;
    }
    pvVar15 = operator_new__(uVar29);
    Imf_3_2::TiledRgbaInputFile::setFrameBuffer
              ((Rgba *)&header,(long)pvVar15 + (long)iVar26 * -8 + (long)-iVar10 * uVar28 * 8,1);
    iVar26 = Imf_3_2::TiledRgbaInputFile::numXTiles((int)&header);
    iVar10 = Imf_3_2::TiledRgbaInputFile::numYTiles((int)&header);
    Imf_3_2::TiledRgbaInputFile::readTiles((int)&header,0,iVar26 + -1,0,iVar10 + -1);
    cVar8 = Imf_3_2::isLossyCompression(local_394);
    if ((cVar8 == '\0') &&
       (std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", comparing",0xb),
       -1 < iVar9)) {
      phVar24 = &pRVar12->a;
      lVar22 = (long)pvVar15 + 6;
      uVar29 = 0;
      do {
        if (-1 < (int)lVar35) {
          uVar14 = 0;
          do {
            fVar37 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar22 + -6 + uVar14 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar24[uVar14 * 4 + -3]._h * 4);
            if ((fVar37 != *pfVar1) || (NAN(fVar37) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].r == p1[y][x].r",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x29f,
                            "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            fVar37 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar22 + -4 + uVar14 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar24[uVar14 * 4 + -2]._h * 4);
            if ((fVar37 != *pfVar1) || (NAN(fVar37) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].g == p1[y][x].g",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x2a0,
                            "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            fVar37 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar22 + -2 + uVar14 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar24[uVar14 * 4 + -1]._h * 4);
            if ((fVar37 != *pfVar1) || (NAN(fVar37) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].b == p1[y][x].b",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x2a1,
                            "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            fVar37 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar22 + uVar14 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar24[uVar14 * 4]._h * 4);
            if ((fVar37 != *pfVar1) || (NAN(fVar37) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].a == p1[y][x].a",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x2a2,
                            "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            uVar14 = uVar14 + 1;
          } while ((uVar28 & 0xffffffff) != uVar14);
        }
        uVar29 = uVar29 + 1;
        phVar24 = phVar24 + lVar21 * 4;
        lVar22 = lVar22 + uVar28 * 8;
      } while (uVar29 != uVar34);
    }
    operator_delete__(pvVar15);
    Imf_3_2::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&header);
    Imf_3_2::StdIFStream::~StdIFStream((StdIFStream *)&ofs);
    std::ifstream::~ifstream(&os);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,", reading (memory-mapped)",0x19);
    anon_unknown.dwarf_156821::MMIFStream::MMIFStream((MMIFStream *)&os,_Var5._M_p);
    iVar26 = Imf_3_2::globalThreadCount();
    Imf_3_2::TiledRgbaInputFile::TiledRgbaInputFile
              ((TiledRgbaInputFile *)&ofs,(IStream *)&os,iVar26);
    piVar13 = (int *)Imf_3_2::TiledRgbaInputFile::dataWindow();
    iVar26 = *piVar13;
    lVar35 = (long)piVar13[2] - (long)iVar26;
    uVar28 = lVar35 + 1;
    iVar10 = piVar13[1];
    iVar9 = piVar13[3] - iVar10;
    uVar34 = iVar9 + 1;
    uVar14 = (long)(int)uVar34 * uVar28;
    uVar29 = uVar14 * 8;
    if (0x1fffffffffffffff < uVar14) {
      uVar29 = 0xffffffffffffffff;
    }
    pvVar15 = operator_new__(uVar29);
    Imf_3_2::TiledRgbaInputFile::setFrameBuffer
              ((Rgba *)&ofs,(long)pvVar15 + (long)iVar26 * -8 + (long)-iVar10 * uVar28 * 8,1);
    iVar26 = Imf_3_2::TiledRgbaInputFile::numXTiles((int)&ofs);
    iVar10 = Imf_3_2::TiledRgbaInputFile::numYTiles((int)&ofs);
    Imf_3_2::TiledRgbaInputFile::readTiles((int)&ofs,0,iVar26 + -1,0,iVar10 + -1);
    cVar8 = Imf_3_2::isLossyCompression(local_394);
    if ((cVar8 == '\0') &&
       (std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", comparing",0xb),
       -1 < iVar9)) {
      phVar24 = &(p1._data)->a;
      lVar21 = (long)pvVar15 + 6;
      uVar29 = 0;
      do {
        if (-1 < (int)lVar35) {
          uVar14 = 0;
          do {
            fVar37 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar21 + -6 + uVar14 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar24[uVar14 * 4 + -3]._h * 4);
            if ((fVar37 != *pfVar1) || (NAN(fVar37) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].r == p1[y][x].r",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x2be,
                            "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            fVar37 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar21 + -4 + uVar14 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar24[uVar14 * 4 + -2]._h * 4);
            if ((fVar37 != *pfVar1) || (NAN(fVar37) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].g == p1[y][x].g",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x2bf,
                            "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            fVar37 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar21 + -2 + uVar14 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar24[uVar14 * 4 + -1]._h * 4);
            if ((fVar37 != *pfVar1) || (NAN(fVar37) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].b == p1[y][x].b",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x2c0,
                            "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            fVar37 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar21 + uVar14 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar24[uVar14 * 4]._h * 4);
            if ((fVar37 != *pfVar1) || (NAN(fVar37) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].a == p1[y][x].a",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x2c1,
                            "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                           );
            }
            uVar14 = uVar14 + 1;
          } while ((uVar28 & 0xffffffff) != uVar14);
        }
        uVar29 = uVar29 + 1;
        phVar24 = phVar24 + p1._sizeY * 4;
        lVar21 = lVar21 + uVar28 * 8;
      } while (uVar29 != uVar34);
    }
    operator_delete__(pvVar15);
    Imf_3_2::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&ofs);
    anon_unknown.dwarf_156821::MMIFStream::~MMIFStream((MMIFStream *)&os);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    remove(_Var5._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != &__str.field_2) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"tiled stringstream:",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    _header = (Rgba)&local_370;
    local_378 = 0;
    local_370 = local_370 & 0xffffffffffffff00;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing",7);
    Imf_3_2::StdOSStream::StdOSStream((StdOSStream *)&os);
    __str._M_dataplus._M_p = (pointer)0x0;
    Imf_3_2::Header::Header
              ((Header *)&ofs,0x77,0xed,1.0,(Vec2 *)&__str,1.0,INCREASING_Y,ZIP_COMPRESSION);
    iVar26 = Imf_3_2::globalThreadCount();
    Imf_3_2::TiledRgbaOutputFile::TiledRgbaOutputFile
              ((TiledRgbaOutputFile *)&out,(OStream *)&os,(Header *)&ofs,WRITE_RGBA,0x14,0x14,
               ONE_LEVEL,ROUND_DOWN,iVar26);
    pRVar12 = p1._data;
    Imf_3_2::TiledRgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)p1._data,1);
    iVar9 = (int)(Rgba *)&out;
    iVar26 = Imf_3_2::TiledRgbaOutputFile::numXTiles(iVar9);
    iVar10 = Imf_3_2::TiledRgbaOutputFile::numYTiles(iVar9);
    Imf_3_2::TiledRgbaOutputFile::writeTiles(iVar9,0,iVar26 + -1,0,iVar10 + -1);
    Imf_3_2::StdOSStream::str_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&header,(string *)&__str);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != &__str.field_2) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    Imf_3_2::TiledRgbaOutputFile::~TiledRgbaOutputFile((TiledRgbaOutputFile *)&out);
    Imf_3_2::Header::~Header((Header *)&ofs);
    Imf_3_2::StdOSStream::~StdOSStream((StdOSStream *)&os);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", reading",9);
    Imf_3_2::StdISStream::StdISStream((StdISStream *)&os);
    Imf_3_2::StdISStream::clear();
    Imf_3_2::StdISStream::str((string *)&os);
    iVar26 = Imf_3_2::globalThreadCount();
    Imf_3_2::TiledRgbaInputFile::TiledRgbaInputFile
              ((TiledRgbaInputFile *)&ofs,(IStream *)&os,iVar26);
    piVar13 = (int *)Imf_3_2::TiledRgbaInputFile::dataWindow();
    iVar26 = *piVar13;
    lVar35 = (long)piVar13[2] - (long)iVar26;
    uVar29 = lVar35 + 1;
    iVar10 = piVar13[1];
    iVar9 = piVar13[3] - iVar10;
    uVar34 = iVar9 + 1;
    uVar14 = (long)(int)uVar34 * uVar29;
    uVar28 = uVar14 * 8;
    if (0x1fffffffffffffff < uVar14) {
      uVar28 = 0xffffffffffffffff;
    }
    pvVar15 = operator_new__(uVar28);
    Imf_3_2::TiledRgbaInputFile::setFrameBuffer
              ((Rgba *)&ofs,(long)pvVar15 + (long)iVar26 * -8 + (long)-iVar10 * uVar29 * 8,1);
    iVar27 = (int)(Rgba *)&ofs;
    iVar26 = Imf_3_2::TiledRgbaInputFile::numXTiles(iVar27);
    iVar10 = Imf_3_2::TiledRgbaInputFile::numYTiles(iVar27);
    Imf_3_2::TiledRgbaInputFile::readTiles(iVar27,0,iVar26 + -1,0,iVar10 + -1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", comparing",0xb);
    if (-1 < iVar9) {
      phVar24 = &pRVar12->a;
      lVar21 = (long)pvVar15 + 6;
      uVar28 = 0;
      do {
        if (-1 < (int)lVar35) {
          uVar14 = 0;
          do {
            fVar37 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar21 + -6 + uVar14 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar24[uVar14 * 4 + -3]._h * 4);
            if ((fVar37 != *pfVar1) || (NAN(fVar37) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].r == p1[y][x].r",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x3d0,
                            "void (anonymous namespace)::writeReadTiles(int, int, const Array2D<Rgba> &)"
                           );
            }
            fVar37 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar21 + -4 + uVar14 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar24[uVar14 * 4 + -2]._h * 4);
            if ((fVar37 != *pfVar1) || (NAN(fVar37) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].g == p1[y][x].g",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x3d1,
                            "void (anonymous namespace)::writeReadTiles(int, int, const Array2D<Rgba> &)"
                           );
            }
            fVar37 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar21 + -2 + uVar14 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar24[uVar14 * 4 + -1]._h * 4);
            if ((fVar37 != *pfVar1) || (NAN(fVar37) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].b == p1[y][x].b",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x3d2,
                            "void (anonymous namespace)::writeReadTiles(int, int, const Array2D<Rgba> &)"
                           );
            }
            fVar37 = *(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)(lVar21 + uVar14 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar24[uVar14 * 4]._h * 4);
            if ((fVar37 != *pfVar1) || (NAN(fVar37) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].a == p1[y][x].a",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x3d3,
                            "void (anonymous namespace)::writeReadTiles(int, int, const Array2D<Rgba> &)"
                           );
            }
            uVar14 = uVar14 + 1;
          } while ((uVar29 & 0xffffffff) != uVar14);
        }
        uVar28 = uVar28 + 1;
        phVar24 = phVar24 + p1._sizeY * 4;
        lVar21 = lVar21 + uVar29 * 8;
      } while (uVar28 != uVar34);
    }
    operator_delete__(pvVar15);
    Imf_3_2::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&ofs);
    Imf_3_2::StdISStream::~StdISStream((StdISStream *)&os);
    cVar8 = std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    iVar10 = (int)cVar8;
    std::ostream::put('X');
    std::ostream::flush();
    iVar26 = extraout_EDX;
    if (_header != (Rgba)&local_370) {
      uVar29 = local_370 + 1;
      operator_delete((void *)_header,uVar29);
      iVar10 = (int)uVar29;
      iVar26 = extraout_EDX_00;
    }
    anon_unknown.dwarf_156821::fillPixels1(&p1,iVar10,iVar26);
    _out = (Rgba)local_2f8;
    pcVar2 = (tempDir->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&out,pcVar2,pcVar2 + tempDir->_M_string_length);
    std::__cxx11::string::append((char *)&out);
    local_2a8 = _out;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"scan-line based multipart file:",0x1f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing",7);
    remove((char *)local_2a8);
    std::ofstream::ofstream(&os);
    RVar6 = local_2a8;
    std::filebuf::open((char *)local_230,local_2a8._0_4_);
    Imf_3_2::StdOFStream::StdOFStream(&ofs,&os,(char *)RVar6);
    std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::vector
              (&headers,2,(allocator_type *)&header);
    __str._M_dataplus._M_p = (pointer)0x0;
    Imf_3_2::Header::Header(&header,0x77,0xed,1.0,(Vec2 *)&__str,1.0,INCREASING_Y,local_394);
    Imf_3_2::Header::operator=
              (headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl
               .super__Vector_impl_data._M_start,&header);
    Imf_3_2::Header::~Header(&header);
    local_378 = 5;
    local_370 = CONCAT26(local_370._6_2_,0x3174726170);
    _header = (Rgba)&local_370;
    Imf_3_2::Header::setName
              ((string *)
               headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl
               .super__Vector_impl_data._M_start);
    if (_header != (Rgba)&local_370) {
      operator_delete((void *)_header,local_370 + 1);
    }
    pcVar16 = (char *)Imf_3_2::Header::channels();
    Imf_3_2::Channel::Channel((Channel *)&header,HALF,1,1,false);
    Imf_3_2::ChannelList::insert(pcVar16,(Channel *)0x1bd903);
    pcVar16 = (char *)Imf_3_2::Header::channels();
    Imf_3_2::Channel::Channel((Channel *)&header,HALF,1,1,false);
    Imf_3_2::ChannelList::insert(pcVar16,(Channel *)0x1bd916);
    pcVar16 = (char *)Imf_3_2::Header::channels();
    Imf_3_2::Channel::Channel((Channel *)&header,HALF,1,1,false);
    Imf_3_2::ChannelList::insert(pcVar16,(Channel *)0x1bd929);
    pcVar16 = (char *)Imf_3_2::Header::channels();
    Imf_3_2::Channel::Channel((Channel *)&header,HALF,1,1,false);
    Imf_3_2::ChannelList::insert(pcVar16,(Channel *)0x1c76de);
    Imf_3_2::Header::setType
              ((string *)
               headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl
               .super__Vector_impl_data._M_start);
    Imf_3_2::Header::operator=
              (headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl
               .super__Vector_impl_data._M_start + 0x38,
               headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl
               .super__Vector_impl_data._M_start);
    local_378 = 5;
    local_370 = CONCAT26(local_370._6_2_,0x3274726170);
    _header = (Rgba)&local_370;
    Imf_3_2::Header::setName
              ((string *)
               (headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
                _M_impl.super__Vector_impl_data._M_start + 0x38));
    if (_header != (Rgba)&local_370) {
      operator_delete((void *)_header,local_370 + 1);
    }
    pHVar7 = headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar26 = Imf_3_2::globalThreadCount();
    Imf_3_2::MultiPartOutputFile::MultiPartOutputFile(&out_4,(OStream *)&ofs,pHVar7,2,false,iVar26);
    pRVar12 = p1._data;
    __str._M_string_length = __str._M_string_length & 0xffffffff00000000;
    __str.field_2._M_allocated_capacity = 0;
    __str.field_2._8_8_ = &__str._M_string_length;
    Imf_3_2::Slice::Slice((Slice *)&header,HALF,(char *)p1._data,8,0x3b8,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&__str,(Slice *)0x1bd903);
    Imf_3_2::Slice::Slice((Slice *)&header,HALF,(char *)&pRVar12->g,8,0x3b8,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&__str,(Slice *)0x1bd916);
    Imf_3_2::Slice::Slice((Slice *)&header,HALF,(char *)&pRVar12->b,8,0x3b8,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&__str,(Slice *)0x1bd929);
    Imf_3_2::Slice::Slice((Slice *)&header,HALF,(char *)&pRVar12->a,8,0x3b8,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&__str,(Slice *)0x1c76de);
    iVar26 = 0;
    do {
      Imf_3_2::OutputPart::OutputPart((OutputPart *)&header,&out_4,iVar26);
      Imf_3_2::OutputPart::setFrameBuffer((FrameBuffer *)&header);
      Imf_3_2::OutputPart::writePixels((int)(OutputPart *)&header);
      iVar26 = iVar26 + 1;
    } while (iVar26 == 1);
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                 *)&__str);
    Imf_3_2::MultiPartOutputFile::~MultiPartOutputFile(&out_4);
    std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::~vector(&headers);
    Imf_3_2::StdOFStream::~StdOFStream(&ofs);
    _os = lVar3;
    *(undefined8 *)(&os + *(long *)(lVar3 + -0x18)) = uVar4;
    std::filebuf::~filebuf(local_230);
    std::ios_base::~ios_base(aiStack_140);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", reading",9);
    std::ifstream::ifstream(&os);
    RVar6 = local_2a8;
    std::filebuf::open(local_228,local_2a8._0_4_);
    Imf_3_2::StdIFStream::StdIFStream((StdIFStream *)&ofs,(ifstream *)&os,(char *)RVar6);
    iVar26 = Imf_3_2::globalThreadCount();
    uVar20 = 1;
    Imf_3_2::MultiPartInputFile::MultiPartInputFile
              ((MultiPartInputFile *)&headers,(IStream *)&ofs,iVar26,true);
    iVar26 = Imf_3_2::MultiPartInputFile::parts();
    if (iVar26 != 2) {
      __assert_fail("in.parts () == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                    ,0x1d5,
                    "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                   );
    }
    Imf_3_2::MultiPartInputFile::header((int)&headers);
    puVar17 = (undefined8 *)Imf_3_2::Header::dataWindow();
    Imf_3_2::MultiPartInputFile::header((int)&headers);
    puVar18 = (undefined8 *)Imf_3_2::Header::dataWindow();
    iVar26 = -(uint)((int)*puVar18 == (int)*puVar17);
    iVar10 = -(uint)((int)((ulong)*puVar18 >> 0x20) == (int)((ulong)*puVar17 >> 0x20));
    auVar39._4_4_ = iVar26;
    auVar39._0_4_ = iVar26;
    auVar39._8_4_ = iVar10;
    auVar39._12_4_ = iVar10;
    iVar26 = movmskpd(uVar20,auVar39);
    if ((iVar26 != 3) ||
       (iVar26 = -(uint)((int)puVar18[1] == (int)puVar17[1]),
       iVar10 = -(uint)((int)((ulong)puVar18[1] >> 0x20) == (int)((ulong)puVar17[1] >> 0x20)),
       auVar40._4_4_ = iVar26, auVar40._0_4_ = iVar26, auVar40._8_4_ = iVar10,
       auVar40._12_4_ = iVar10, iVar26 = movmskpd((int)puVar18,auVar40), iVar26 != 3)) {
      __assert_fail("in.header (0).dataWindow () == in.header (1).dataWindow ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                    ,0x1d7,
                    "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                   );
    }
    Imf_3_2::MultiPartInputFile::header((int)&headers);
    piVar13 = (int *)Imf_3_2::Header::dataWindow();
    iVar26 = piVar13[2];
    lVar35 = (long)*piVar13;
    uVar29 = (iVar26 - lVar35) + 1;
    iVar10 = piVar13[1];
    iVar9 = piVar13[3] - iVar10;
    uVar34 = iVar9 + 1;
    uVar14 = (long)(int)uVar34 * uVar29;
    uVar28 = uVar14 * 8;
    if (0x1fffffffffffffff < uVar14) {
      uVar28 = 0xffffffffffffffff;
    }
    pvVar15 = operator_new__(uVar28);
    __str._M_string_length = __str._M_string_length & 0xffffffff00000000;
    __str.field_2._M_allocated_capacity = 0;
    __str.field_2._8_8_ = &__str._M_string_length;
    lVar21 = (long)-iVar10 * uVar29;
    uVar28 = uVar29 * 8;
    local_2a0 = pvVar15;
    Imf_3_2::Slice::Slice
              ((Slice *)&header,HALF,(char *)((long)pvVar15 + lVar35 * -8 + lVar21 * 8),8,uVar28,1,1
               ,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&__str,(Slice *)0x1bd903);
    Imf_3_2::Slice::Slice
              ((Slice *)&header,HALF,(char *)((long)pvVar15 + lVar35 * -8 + lVar21 * 8 + 2),8,uVar28
               ,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&__str,(Slice *)0x1bd916);
    Imf_3_2::Slice::Slice
              ((Slice *)&header,HALF,(char *)((long)pvVar15 + lVar35 * -8 + lVar21 * 8 + 4),8,uVar28
               ,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&__str,(Slice *)0x1bd929);
    Imf_3_2::Slice::Slice
              ((Slice *)&header,HALF,(char *)((long)pvVar15 + lVar35 * -8 + lVar21 * 8 + 6),8,uVar28
               ,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&__str,(Slice *)0x1c76de);
    lVar21 = p1._sizeY;
    lVar22 = (long)local_2a0 + 6;
    iVar10 = 0;
    do {
      Imf_3_2::InputPart::InputPart((InputPart *)&header,(MultiPartInputFile *)&headers,iVar10);
      Imf_3_2::InputPart::setFrameBuffer((FrameBuffer *)&header);
      Imf_3_2::InputPart::readPixels((int)&header,piVar13[1]);
      cVar8 = Imf_3_2::isLossyCompression(local_394);
      if (cVar8 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,", comparing pt ",0xf);
        std::ostream::operator<<(&std::cout,iVar10);
        if (-1 < iVar9) {
          uVar14 = 0;
          lVar32 = lVar22;
          phVar24 = &pRVar12->a;
          do {
            if (-1 < (int)(iVar26 - lVar35)) {
              uVar30 = 0;
              do {
                fVar37 = *(float *)(_imath_half_to_float_table +
                                   (ulong)*(ushort *)(lVar32 + -6 + uVar30 * 8) * 4);
                pfVar1 = (float *)(_imath_half_to_float_table +
                                  (ulong)phVar24[uVar30 * 4 + -3]._h * 4);
                if ((fVar37 != *pfVar1) || (NAN(fVar37) || NAN(*pfVar1))) {
                  __assert_fail("p2[y][x].r == p1[y][x].r",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                                ,0x20b,
                                "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                               );
                }
                fVar37 = *(float *)(_imath_half_to_float_table +
                                   (ulong)*(ushort *)(lVar32 + -4 + uVar30 * 8) * 4);
                pfVar1 = (float *)(_imath_half_to_float_table +
                                  (ulong)phVar24[uVar30 * 4 + -2]._h * 4);
                if ((fVar37 != *pfVar1) || (NAN(fVar37) || NAN(*pfVar1))) {
                  __assert_fail("p2[y][x].g == p1[y][x].g",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                                ,0x20c,
                                "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                               );
                }
                fVar37 = *(float *)(_imath_half_to_float_table +
                                   (ulong)*(ushort *)(lVar32 + -2 + uVar30 * 8) * 4);
                pfVar1 = (float *)(_imath_half_to_float_table +
                                  (ulong)phVar24[uVar30 * 4 + -1]._h * 4);
                if ((fVar37 != *pfVar1) || (NAN(fVar37) || NAN(*pfVar1))) {
                  __assert_fail("p2[y][x].b == p1[y][x].b",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                                ,0x20d,
                                "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                               );
                }
                fVar37 = *(float *)(_imath_half_to_float_table +
                                   (ulong)*(ushort *)(lVar32 + uVar30 * 8) * 4);
                pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar24[uVar30 * 4]._h * 4);
                if ((fVar37 != *pfVar1) || (NAN(fVar37) || NAN(*pfVar1))) {
                  __assert_fail("p2[y][x].a == p1[y][x].a",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                                ,0x20e,
                                "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                               );
                }
                uVar30 = uVar30 + 1;
              } while ((uVar29 & 0xffffffff) != uVar30);
            }
            uVar14 = uVar14 + 1;
            phVar24 = phVar24 + lVar21 * 4;
            lVar32 = lVar32 + uVar28;
          } while (uVar14 != uVar34);
        }
      }
      bVar36 = iVar10 == 0;
      iVar10 = iVar10 + 1;
    } while (bVar36);
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                 *)&__str);
    operator_delete__(local_2a0);
    Imf_3_2::MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)&headers);
    Imf_3_2::StdIFStream::~StdIFStream((StdIFStream *)&ofs);
    std::ifstream::~ifstream(&os);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,", reading (memory-mapped)",0x19);
    anon_unknown.dwarf_156821::MMIFStream::MMIFStream((MMIFStream *)&os,(char *)local_2a8);
    iVar26 = Imf_3_2::globalThreadCount();
    uVar20 = 1;
    Imf_3_2::MultiPartInputFile::MultiPartInputFile
              ((MultiPartInputFile *)&__str,(IStream *)&os,iVar26,true);
    iVar26 = Imf_3_2::MultiPartInputFile::parts();
    if (iVar26 != 2) {
      __assert_fail("in.parts () == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                    ,0x21a,
                    "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                   );
    }
    Imf_3_2::MultiPartInputFile::header((int)&__str);
    puVar17 = (undefined8 *)Imf_3_2::Header::dataWindow();
    Imf_3_2::MultiPartInputFile::header((int)&__str);
    puVar18 = (undefined8 *)Imf_3_2::Header::dataWindow();
    iVar26 = -(uint)((int)*puVar18 == (int)*puVar17);
    iVar10 = -(uint)((int)((ulong)*puVar18 >> 0x20) == (int)((ulong)*puVar17 >> 0x20));
    auVar41._4_4_ = iVar26;
    auVar41._0_4_ = iVar26;
    auVar41._8_4_ = iVar10;
    auVar41._12_4_ = iVar10;
    iVar26 = movmskpd(uVar20,auVar41);
    if ((iVar26 != 3) ||
       (iVar26 = -(uint)((int)puVar18[1] == (int)puVar17[1]),
       iVar10 = -(uint)((int)((ulong)puVar18[1] >> 0x20) == (int)((ulong)puVar17[1] >> 0x20)),
       auVar42._4_4_ = iVar26, auVar42._0_4_ = iVar26, auVar42._8_4_ = iVar10,
       auVar42._12_4_ = iVar10, iVar26 = movmskpd((int)puVar18,auVar42), iVar26 != 3)) {
      __assert_fail("in.header (0).dataWindow () == in.header (1).dataWindow ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                    ,0x21c,
                    "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                   );
    }
    Imf_3_2::MultiPartInputFile::header((int)&__str);
    piVar13 = (int *)Imf_3_2::Header::dataWindow();
    iVar26 = piVar13[2];
    lVar35 = (long)*piVar13;
    uVar29 = (iVar26 - lVar35) + 1;
    iVar10 = piVar13[1];
    iVar9 = piVar13[3] - iVar10;
    uVar34 = iVar9 + 1;
    uVar14 = (long)(int)uVar34 * uVar29;
    uVar28 = uVar14 * 8;
    if (0x1fffffffffffffff < uVar14) {
      uVar28 = 0xffffffffffffffff;
    }
    pvVar15 = operator_new__(uVar28);
    local_378 = local_378 & 0xffffffff00000000;
    local_370 = 0;
    local_368 = &local_378;
    local_358 = 0;
    lVar21 = (long)-iVar10 * uVar29;
    uVar28 = uVar29 * 8;
    local_360 = local_368;
    local_2a0 = pvVar15;
    Imf_3_2::Slice::Slice
              ((Slice *)&ofs,HALF,(char *)((long)pvVar15 + lVar35 * -8 + lVar21 * 8),8,uVar28,1,1,
               0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&header,(Slice *)0x1bd903);
    Imf_3_2::Slice::Slice
              ((Slice *)&ofs,HALF,(char *)((long)pvVar15 + lVar35 * -8 + 2 + lVar21 * 8),8,uVar28,1,
               1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&header,(Slice *)0x1bd916);
    Imf_3_2::Slice::Slice
              ((Slice *)&ofs,HALF,(char *)((long)pvVar15 + lVar35 * -8 + 4 + lVar21 * 8),8,uVar28,1,
               1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&header,(Slice *)0x1bd929);
    Imf_3_2::Slice::Slice
              ((Slice *)&ofs,HALF,(char *)((long)pvVar15 + lVar35 * -8 + 6 + lVar21 * 8),8,uVar28,1,
               1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&header,(Slice *)0x1c76de);
    lVar21 = p1._sizeY;
    phVar24 = &(p1._data)->a;
    lVar22 = (long)local_2a0 + 6;
    iVar10 = 0;
    do {
      Imf_3_2::InputPart::InputPart((InputPart *)&ofs,(MultiPartInputFile *)&__str,iVar10);
      Imf_3_2::InputPart::setFrameBuffer((FrameBuffer *)&ofs);
      Imf_3_2::InputPart::readPixels((int)&ofs,piVar13[1]);
      cVar8 = Imf_3_2::isLossyCompression(local_394);
      if (cVar8 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,", comparing pt ",0xf);
        std::ostream::operator<<(&std::cout,iVar10);
        if (-1 < iVar9) {
          uVar14 = 0;
          lVar32 = lVar22;
          phVar23 = phVar24;
          do {
            if (-1 < (int)(iVar26 - lVar35)) {
              uVar30 = 0;
              do {
                fVar37 = *(float *)(_imath_half_to_float_table +
                                   (ulong)*(ushort *)(lVar32 + -6 + uVar30 * 8) * 4);
                pfVar1 = (float *)(_imath_half_to_float_table +
                                  (ulong)phVar23[uVar30 * 4 + -3]._h * 4);
                if ((fVar37 != *pfVar1) || (NAN(fVar37) || NAN(*pfVar1))) {
                  __assert_fail("p2[y][x].r == p1[y][x].r",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                                ,0x250,
                                "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                               );
                }
                fVar37 = *(float *)(_imath_half_to_float_table +
                                   (ulong)*(ushort *)(lVar32 + -4 + uVar30 * 8) * 4);
                pfVar1 = (float *)(_imath_half_to_float_table +
                                  (ulong)phVar23[uVar30 * 4 + -2]._h * 4);
                if ((fVar37 != *pfVar1) || (NAN(fVar37) || NAN(*pfVar1))) {
                  __assert_fail("p2[y][x].g == p1[y][x].g",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                                ,0x251,
                                "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                               );
                }
                fVar37 = *(float *)(_imath_half_to_float_table +
                                   (ulong)*(ushort *)(lVar32 + -2 + uVar30 * 8) * 4);
                pfVar1 = (float *)(_imath_half_to_float_table +
                                  (ulong)phVar23[uVar30 * 4 + -1]._h * 4);
                if ((fVar37 != *pfVar1) || (NAN(fVar37) || NAN(*pfVar1))) {
                  __assert_fail("p2[y][x].b == p1[y][x].b",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                                ,0x252,
                                "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                               );
                }
                fVar37 = *(float *)(_imath_half_to_float_table +
                                   (ulong)*(ushort *)(lVar32 + uVar30 * 8) * 4);
                pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar23[uVar30 * 4]._h * 4);
                if ((fVar37 != *pfVar1) || (NAN(fVar37) || NAN(*pfVar1))) {
                  __assert_fail("p2[y][x].a == p1[y][x].a",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                                ,0x253,
                                "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                               );
                }
                uVar30 = uVar30 + 1;
              } while ((uVar29 & 0xffffffff) != uVar30);
            }
            uVar14 = uVar14 + 1;
            phVar23 = phVar23 + lVar21 * 4;
            lVar32 = lVar32 + uVar28;
          } while (uVar14 != uVar34);
        }
      }
      bVar36 = iVar10 == 0;
      iVar10 = iVar10 + 1;
    } while (bVar36);
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                 *)&header);
    operator_delete__(local_2a0);
    Imf_3_2::MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)&__str);
    anon_unknown.dwarf_156821::MMIFStream::~MMIFStream((MMIFStream *)&os);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    remove((char *)local_2a8);
    if (_out != (Rgba)local_2f8) {
      operator_delete((void *)_out,local_2f8[0] + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"scan-line based multipart stringstream:",0x27);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    __str._M_dataplus._M_p = (pointer)&__str.field_2;
    __str._M_string_length = 0;
    __str.field_2._M_allocated_capacity = __str.field_2._M_allocated_capacity & 0xffffffffffffff00;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing",7);
    Imf_3_2::StdOSStream::StdOSStream((StdOSStream *)&os);
    std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::vector
              ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)&out,2,
               (allocator_type *)&ofs);
    _header = 0;
    hStack_37e._h = 0;
    hStack_37c._h = 0;
    hStack_37a._h = 0;
    Imf_3_2::Header::Header
              ((Header *)&ofs,0x77,0xed,1.0,(Vec2 *)&header,1.0,INCREASING_Y,ZIP_COMPRESSION);
    Imf_3_2::Header::operator=((Header *)_out,(Header *)&ofs);
    Imf_3_2::Header::~Header((Header *)&ofs);
    uStack_2d4 = 0x31;
    local_2d8 = 0x74726170;
    uStack_2d3 = 0;
    _ofs = (Rgba)&local_2d8;
    Imf_3_2::Header::setName((string *)_out);
    if (_ofs != (Rgba)&local_2d8) {
      operator_delete((void *)_ofs,
                      CONCAT26(uStack_2d2,CONCAT15(uStack_2d3,CONCAT14(uStack_2d4,local_2d8))) + 1);
    }
    pcVar16 = (char *)Imf_3_2::Header::channels();
    Imf_3_2::Channel::Channel((Channel *)&ofs,HALF,1,1,false);
    Imf_3_2::ChannelList::insert(pcVar16,(Channel *)0x1bd903);
    pcVar16 = (char *)Imf_3_2::Header::channels();
    Imf_3_2::Channel::Channel((Channel *)&ofs,HALF,1,1,false);
    Imf_3_2::ChannelList::insert(pcVar16,(Channel *)0x1bd916);
    pcVar16 = (char *)Imf_3_2::Header::channels();
    Imf_3_2::Channel::Channel((Channel *)&ofs,HALF,1,1,false);
    Imf_3_2::ChannelList::insert(pcVar16,(Channel *)0x1bd929);
    pcVar16 = (char *)Imf_3_2::Header::channels();
    Imf_3_2::Channel::Channel((Channel *)&ofs,HALF,1,1,false);
    Imf_3_2::ChannelList::insert(pcVar16,(Channel *)0x1c76de);
    Imf_3_2::Header::setType((string *)_out);
    Imf_3_2::Header::operator=((Header *)((long)_out + 0x38),(Header *)_out);
    uStack_2d4 = 0x32;
    local_2d8 = 0x74726170;
    uStack_2d3 = 0;
    _ofs = (Rgba)&local_2d8;
    Imf_3_2::Header::setName((string *)((long)_out + 0x38));
    if (_ofs != (Rgba)&local_2d8) {
      operator_delete((void *)_ofs,
                      CONCAT26(uStack_2d2,CONCAT15(uStack_2d3,CONCAT14(uStack_2d4,local_2d8))) + 1);
    }
    RVar6 = _out;
    iVar26 = Imf_3_2::globalThreadCount();
    Imf_3_2::MultiPartOutputFile::MultiPartOutputFile
              ((MultiPartOutputFile *)&headers,(OStream *)&os,(Header *)RVar6,2,false,iVar26);
    pRVar12 = p1._data;
    local_378 = local_378 & 0xffffffff00000000;
    local_370 = 0;
    local_368 = &local_378;
    local_358 = 0;
    local_360 = local_368;
    Imf_3_2::Slice::Slice((Slice *)&ofs,HALF,(char *)p1._data,8,0x3b8,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&header,(Slice *)0x1bd903);
    Imf_3_2::Slice::Slice((Slice *)&ofs,HALF,(char *)&pRVar12->g,8,0x3b8,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&header,(Slice *)0x1bd916);
    Imf_3_2::Slice::Slice((Slice *)&ofs,HALF,(char *)&pRVar12->b,8,0x3b8,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&header,(Slice *)0x1bd929);
    Imf_3_2::Slice::Slice((Slice *)&ofs,HALF,(char *)&pRVar12->a,8,0x3b8,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&header,(Slice *)0x1c76de);
    iVar26 = 0;
    do {
      Imf_3_2::OutputPart::OutputPart((OutputPart *)&ofs,(MultiPartOutputFile *)&headers,iVar26);
      Imf_3_2::OutputPart::setFrameBuffer((FrameBuffer *)&ofs);
      Imf_3_2::OutputPart::writePixels((int)(OutputPart *)&ofs);
      iVar26 = iVar26 + 1;
    } while (iVar26 == 1);
    Imf_3_2::StdOSStream::str_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&__str,(string *)&ofs);
    if (_ofs != (Rgba)&local_2d8) {
      operator_delete((void *)_ofs,
                      CONCAT26(uStack_2d2,CONCAT15(uStack_2d3,CONCAT14(uStack_2d4,local_2d8))) + 1);
    }
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                 *)&header);
    Imf_3_2::MultiPartOutputFile::~MultiPartOutputFile((MultiPartOutputFile *)&headers);
    std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::~vector
              ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)&out);
    Imf_3_2::StdOSStream::~StdOSStream((StdOSStream *)&os);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", reading",9);
    Imf_3_2::StdISStream::StdISStream((StdISStream *)&os);
    Imf_3_2::StdISStream::clear();
    Imf_3_2::StdISStream::str((string *)&os);
    iVar26 = Imf_3_2::globalThreadCount();
    uVar20 = 1;
    Imf_3_2::MultiPartInputFile::MultiPartInputFile
              ((MultiPartInputFile *)&out,(IStream *)&os,iVar26,true);
    iVar26 = Imf_3_2::MultiPartInputFile::parts();
    if (iVar26 != 2) {
      __assert_fail("in.parts () == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                    ,0x35d,
                    "void (anonymous namespace)::writeReadMultiPart(int, int, const Array2D<Rgba> &)"
                   );
    }
    Imf_3_2::MultiPartInputFile::header((int)&out);
    puVar17 = (undefined8 *)Imf_3_2::Header::dataWindow();
    Imf_3_2::MultiPartInputFile::header((int)&out);
    puVar18 = (undefined8 *)Imf_3_2::Header::dataWindow();
    iVar26 = -(uint)((int)*puVar18 == (int)*puVar17);
    iVar10 = -(uint)((int)((ulong)*puVar18 >> 0x20) == (int)((ulong)*puVar17 >> 0x20));
    auVar43._4_4_ = iVar26;
    auVar43._0_4_ = iVar26;
    auVar43._8_4_ = iVar10;
    auVar43._12_4_ = iVar10;
    iVar26 = movmskpd(uVar20,auVar43);
    if ((iVar26 != 3) ||
       (iVar26 = -(uint)((int)puVar18[1] == (int)puVar17[1]),
       iVar10 = -(uint)((int)((ulong)puVar18[1] >> 0x20) == (int)((ulong)puVar17[1] >> 0x20)),
       auVar44._4_4_ = iVar26, auVar44._0_4_ = iVar26, auVar44._8_4_ = iVar10,
       auVar44._12_4_ = iVar10, iVar26 = movmskpd((int)puVar18,auVar44), iVar26 != 3)) {
      __assert_fail("in.header (0).dataWindow () == in.header (1).dataWindow ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                    ,0x35f,
                    "void (anonymous namespace)::writeReadMultiPart(int, int, const Array2D<Rgba> &)"
                   );
    }
    Imf_3_2::MultiPartInputFile::header((int)&out);
    piVar13 = (int *)Imf_3_2::Header::dataWindow();
    iVar26 = piVar13[2];
    lVar35 = (long)*piVar13;
    uVar29 = (iVar26 - lVar35) + 1;
    iVar10 = piVar13[1];
    iVar9 = piVar13[3] - iVar10;
    uVar34 = iVar9 + 1;
    uVar14 = (long)(int)uVar34 * uVar29;
    uVar28 = uVar14 * 8;
    if (0x1fffffffffffffff < uVar14) {
      uVar28 = 0xffffffffffffffff;
    }
    pvVar15 = operator_new__(uVar28);
    local_378 = local_378 & 0xffffffff00000000;
    local_370 = 0;
    local_368 = &local_378;
    local_358 = 0;
    lVar21 = (long)-iVar10 * uVar29;
    uVar28 = uVar29 * 8;
    local_360 = local_368;
    local_2a8 = (Rgba)pvVar15;
    Imf_3_2::Slice::Slice
              ((Slice *)&ofs,HALF,(char *)((long)pvVar15 + lVar35 * -8 + lVar21 * 8),8,uVar28,1,1,
               0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&header,(Slice *)0x1bd903);
    Imf_3_2::Slice::Slice
              ((Slice *)&ofs,HALF,(char *)((long)pvVar15 + lVar35 * -8 + lVar21 * 8 + 2),8,uVar28,1,
               1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&header,(Slice *)0x1bd916);
    Imf_3_2::Slice::Slice
              ((Slice *)&ofs,HALF,(char *)((long)pvVar15 + lVar35 * -8 + lVar21 * 8 + 4),8,uVar28,1,
               1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&header,(Slice *)0x1bd929);
    Imf_3_2::Slice::Slice
              ((Slice *)&ofs,HALF,(char *)((long)pvVar15 + lVar35 * -8 + lVar21 * 8 + 6),8,uVar28,1,
               1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&header,(Slice *)0x1c76de);
    lVar21 = p1._sizeY;
    lVar22 = (long)local_2a8 + 6;
    iVar10 = 0;
    do {
      Imf_3_2::InputPart::InputPart((InputPart *)&ofs,(MultiPartInputFile *)&out,iVar10);
      Imf_3_2::InputPart::setFrameBuffer((FrameBuffer *)&ofs);
      Imf_3_2::InputPart::readPixels((int)&ofs,piVar13[1]);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,", comparing pt ",0xf);
      std::ostream::operator<<(&std::cout,iVar10);
      if (-1 < iVar9) {
        uVar14 = 0;
        lVar32 = lVar22;
        phVar24 = &pRVar12->a;
        do {
          if (-1 < (int)(iVar26 - lVar35)) {
            uVar30 = 0;
            do {
              fVar37 = *(float *)(_imath_half_to_float_table +
                                 (ulong)*(ushort *)(lVar32 + -6 + uVar30 * 8) * 4);
              pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar24[uVar30 * 4 + -3]._h * 4
                                );
              if ((fVar37 != *pfVar1) || (NAN(fVar37) || NAN(*pfVar1))) {
                __assert_fail("p2[y][x].r == p1[y][x].r",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x391,
                              "void (anonymous namespace)::writeReadMultiPart(int, int, const Array2D<Rgba> &)"
                             );
              }
              fVar37 = *(float *)(_imath_half_to_float_table +
                                 (ulong)*(ushort *)(lVar32 + -4 + uVar30 * 8) * 4);
              pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar24[uVar30 * 4 + -2]._h * 4
                                );
              if ((fVar37 != *pfVar1) || (NAN(fVar37) || NAN(*pfVar1))) {
                __assert_fail("p2[y][x].g == p1[y][x].g",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x392,
                              "void (anonymous namespace)::writeReadMultiPart(int, int, const Array2D<Rgba> &)"
                             );
              }
              fVar37 = *(float *)(_imath_half_to_float_table +
                                 (ulong)*(ushort *)(lVar32 + -2 + uVar30 * 8) * 4);
              pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar24[uVar30 * 4 + -1]._h * 4
                                );
              if ((fVar37 != *pfVar1) || (NAN(fVar37) || NAN(*pfVar1))) {
                __assert_fail("p2[y][x].b == p1[y][x].b",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x393,
                              "void (anonymous namespace)::writeReadMultiPart(int, int, const Array2D<Rgba> &)"
                             );
              }
              fVar37 = *(float *)(_imath_half_to_float_table +
                                 (ulong)*(ushort *)(lVar32 + uVar30 * 8) * 4);
              pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar24[uVar30 * 4]._h * 4);
              if ((fVar37 != *pfVar1) || (NAN(fVar37) || NAN(*pfVar1))) {
                __assert_fail("p2[y][x].a == p1[y][x].a",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x394,
                              "void (anonymous namespace)::writeReadMultiPart(int, int, const Array2D<Rgba> &)"
                             );
              }
              uVar30 = uVar30 + 1;
            } while ((uVar29 & 0xffffffff) != uVar30);
          }
          uVar14 = uVar14 + 1;
          phVar24 = phVar24 + lVar21 * 4;
          lVar32 = lVar32 + uVar28;
        } while (uVar14 != uVar34);
      }
      bVar36 = iVar10 == 0;
      iVar10 = iVar10 + 1;
    } while (bVar36);
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                 *)&header);
    operator_delete__((void *)local_2a8);
    Imf_3_2::MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)&out);
    Imf_3_2::StdISStream::~StdISStream((StdISStream *)&os);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != &__str.field_2) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    if (p1._data != (Rgba *)0x0) {
      operator_delete__(p1._data);
    }
    local_394 = local_394 + RLE_COMPRESSION;
    if (local_394 == NUM_COMPRESSION_METHODS) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
      std::ostream::put('X');
      std::ostream::flush();
      return;
    }
  } while( true );
}

Assistant:

void
testExistingStreams (const std::string& tempDir)
{
    try
    {
        cout << "Testing reading and writing using existing streams" << endl;

        const int W = 119;
        const int H = 237;

        for (int compression = 0; compression < NUM_COMPRESSION_METHODS;
             ++compression)
        {
            cout << "compression: " << compression << endl;

            Array2D<Rgba> p1 (H, W);

            fillPixels1 (p1, W, H);
            writeReadScanLines (
               (tempDir + "imf_test_streams.exr").c_str (),
               W,
               H,
               static_cast<Compression>(compression),
               p1);
            writeReadScanLines (W, H, p1);

            fillPixels2 (p1, W, H);
            writeReadTiles (
               (tempDir + "imf_test_streams2.exr").c_str (),
               W,
               H,
                static_cast<Compression> (compression),
               p1);
            writeReadTiles (W, H, p1);

            fillPixels1 (p1, W, H);
            writeReadMultiPart (
               (tempDir + "imf_test_streams3.exr").c_str (),
               W,
               H,
                static_cast<Compression> (compression),
               p1);
            writeReadMultiPart (W, H, p1);
        }

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}